

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void greatest_run_suite(greatest_suite_cb *suite_cb,char *suite_name)

{
  int iVar1;
  char *suite_name_local;
  greatest_suite_cb *suite_cb_local;
  
  if (((greatest_info.suite_filter == (char *)0x0) ||
      (iVar1 = greatest_name_match(suite_name,greatest_info.suite_filter), iVar1 != 0)) &&
     ((update_counts_and_reset_suite(), (greatest_info.flags & 1) == 0 ||
      (greatest_info.failed == 0)))) {
    fprintf(_stdout,"\n* Suite %s:\n",suite_name);
    greatest_info.suite.pre_suite = clock();
    if (greatest_info.suite.pre_suite == -1) {
      fprintf(_stdout,"clock error: %s\n","greatest_info.suite.pre_suite");
      exit(1);
    }
    (*suite_cb)();
    greatest_info.suite.post_suite = clock();
    if (greatest_info.suite.post_suite == -1) {
      fprintf(_stdout,"clock error: %s\n","greatest_info.suite.post_suite");
      exit(1);
    }
    report_suite();
  }
  return;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}